

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

char hunyise_main_huase(void)

{
  bool bVar1;
  pointer ppVar2;
  char *pcVar3;
  int local_38;
  char local_31;
  int maxnum;
  char max;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_20;
  iterator it;
  int local_10;
  int wan;
  int bin;
  int tiao;
  
  wan = 0;
  local_10 = 0;
  it.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  ._M_cur._4_4_ = 0;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::begin(&my_active_card_abi_cxx11_);
  while( true ) {
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(&my_active_card_abi_cxx11_);
    bVar1 = std::__detail::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                           *)&local_20);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)ppVar2);
    if (*pcVar3 == 'W') {
      it.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
      ._M_cur._4_4_ =
           it.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
           ._M_cur._4_4_ + 1;
    }
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                           *)&local_20);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)ppVar2);
    if (*pcVar3 == 'B') {
      local_10 = local_10 + 1;
    }
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                           *)&local_20);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)ppVar2);
    if (*pcVar3 == 'T') {
      wan = wan + 1;
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                  *)&local_20,0);
  }
  local_31 = 'n';
  local_38 = 0;
  if (-1 < wan) {
    local_31 = 'T';
    local_38 = wan;
  }
  if (local_38 <= local_10) {
    local_31 = 'B';
    local_38 = local_10;
  }
  if (local_38 <=
      it.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
      ._M_cur._4_4_) {
    local_31 = 'W';
  }
  return local_31;
}

Assistant:

char hunyise_main_huase() {
	int tiao = 0, bin = 0, wan = 0;
	for (auto it = my_active_card.begin(); it != my_active_card.end(); it++) {
		if (it->first[0] == 'W') wan++;
		if (it->first[0] == 'B') bin++;
		if (it->first[0] == 'T') tiao++;
	}
	char max = 'n';
	int maxnum = 0;
	if (tiao >= maxnum) {
		max = 'T';
		maxnum = tiao;
	}
	if (bin >= maxnum) {
		max = 'B';
		maxnum = bin;
	}
	if (wan >= maxnum) {
		max = 'W';
		maxnum = wan;
	}
	return max;
}